

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_math_round(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  TRef TVar2;
  
  if (4 < (*J->base >> 0x18 & 0x1f) - 0xf) {
    TVar2 = lj_ir_tonum(J,*J->base);
    uVar1 = rd->data;
    (J->fold).ins.field_0.ot = 0x340e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar1;
    TVar2 = lj_opt_fold(J);
    *J->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_round(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!tref_isinteger(tr)) {  /* Pass through integers unmodified. */
    tr = emitir(IRTN(IR_FPMATH), lj_ir_tonum(J, tr), rd->data);
    /* Result is integral (or NaN/Inf), but may not fit an int32_t. */
    if (LJ_DUALNUM) {  /* Try to narrow using a guarded conversion to int. */
      lua_Number n = lj_vm_foldfpm(numberVnum(&rd->argv[0]), rd->data);
      if (n == (lua_Number)lj_num2int(n))
	tr = emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_CHECK);
    }
    J->base[0] = tr;
  }
}